

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::C_InitPIN(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_UTF8CHAR_PTR pPin,CK_ULONG ulPinLen)

{
  Session *this_00;
  CK_STATE CVar1;
  Token *this_01;
  CK_RV CVar2;
  ByteString userPIN;
  ByteString local_48;
  
  CVar2 = 400;
  if (this->isInitialised == true) {
    this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
    if (this_00 == (Session *)0x0) {
      CVar2 = 0xb3;
    }
    else {
      CVar1 = Session::getState(this_00);
      CVar2 = 0x101;
      if (CVar1 == 4) {
        this_01 = Session::getToken(this_00);
        if (this_01 == (Token *)0x0) {
          CVar2 = 5;
        }
        else if (pPin == (CK_UTF8CHAR_PTR)0x0) {
          CVar2 = 7;
        }
        else {
          CVar2 = 0xa2;
          if (0xffffffffffffff03 < ulPinLen - 0x100) {
            ByteString::ByteString(&local_48,pPin,ulPinLen);
            CVar2 = Token::initUserPIN(this_01,&local_48);
            local_48._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                      (&local_48.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
          }
        }
      }
    }
  }
  return CVar2;
}

Assistant:

CK_RV SoftHSM::C_InitPIN(CK_SESSION_HANDLE hSession, CK_UTF8CHAR_PTR pPin, CK_ULONG ulPinLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// The SO must be logged in
	if (session->getState() != CKS_RW_SO_FUNCTIONS) return CKR_USER_NOT_LOGGED_IN;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the PIN
	if (pPin == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (ulPinLen < MIN_PIN_LEN || ulPinLen > MAX_PIN_LEN) return CKR_PIN_LEN_RANGE;

	ByteString userPIN(pPin, ulPinLen);

	return token->initUserPIN(userPIN);
}